

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void * op_url_stream_vcreate_impl
                 (OpusFileCallbacks *_cb,char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,
                 __va_list_tag *_ap)

{
  long lVar1;
  uint _proxy_port;
  uint *puVar2;
  void *pvVar3;
  char *_proxy_host;
  uint _skip_certificate_check;
  char *_proxy_user;
  char *_proxy_pass;
  uint uVar4;
  OpusServerInfo *pOVar5;
  undefined8 *puVar6;
  long *plVar7;
  int *piVar8;
  char cVar9;
  
  *_pinfo = (OpusServerInfo *)0x0;
  uVar4 = _ap->gp_offset;
  _proxy_host = (char *)0x0;
  _proxy_port = 0x1f90;
  _proxy_user = (char *)0x0;
  _proxy_pass = (char *)0x0;
  pOVar5 = (OpusServerInfo *)0x0;
  _skip_certificate_check = 0;
  do {
    if (uVar4 < 0x29) {
      plVar7 = (long *)((ulong)uVar4 + (long)_ap->reg_save_area);
      uVar4 = uVar4 + 8;
      _ap->gp_offset = uVar4;
    }
    else {
      plVar7 = (long *)_ap->overflow_arg_area;
      _ap->overflow_arg_area = plVar7 + 1;
    }
    lVar1 = *plVar7;
    if (lVar1 == 0) {
      cVar9 = '\x02';
      goto LAB_0010da76;
    }
    switch(lVar1 << 0x3a | lVar1 - 0x1940U >> 6) {
    case 0:
      if (uVar4 < 0x29) {
        piVar8 = (int *)((ulong)uVar4 + (long)_ap->reg_save_area);
        uVar4 = uVar4 + 8;
        _ap->gp_offset = uVar4;
      }
      else {
        piVar8 = (int *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = piVar8 + 2;
      }
      _skip_certificate_check = (uint)(*piVar8 != 0);
      break;
    case 1:
      if (uVar4 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar4 + (long)_ap->reg_save_area);
        uVar4 = uVar4 + 8;
        _ap->gp_offset = uVar4;
      }
      else {
        puVar6 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar6 + 1;
      }
      _proxy_host = (char *)*puVar6;
      break;
    case 2:
      if (uVar4 < 0x29) {
        puVar2 = (uint *)((ulong)uVar4 + (long)_ap->reg_save_area);
        uVar4 = uVar4 + 8;
        _ap->gp_offset = uVar4;
      }
      else {
        puVar2 = (uint *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar2 + 2;
      }
      _proxy_port = *puVar2;
      cVar9 = 0xffff < _proxy_port;
      goto LAB_0010da76;
    case 3:
      if (uVar4 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar4 + (long)_ap->reg_save_area);
        uVar4 = uVar4 + 8;
        _ap->gp_offset = uVar4;
      }
      else {
        puVar6 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar6 + 1;
      }
      _proxy_user = (char *)*puVar6;
      break;
    case 4:
      if (uVar4 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar4 + (long)_ap->reg_save_area);
        uVar4 = uVar4 + 8;
        _ap->gp_offset = uVar4;
      }
      else {
        puVar6 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar6 + 1;
      }
      _proxy_pass = (char *)*puVar6;
      break;
    case 5:
      if (uVar4 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar4 + (long)_ap->reg_save_area);
        uVar4 = uVar4 + 8;
        _ap->gp_offset = uVar4;
      }
      else {
        puVar6 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = puVar6 + 1;
      }
      pOVar5 = (OpusServerInfo *)*puVar6;
      break;
    default:
      cVar9 = '\x01';
      goto LAB_0010da76;
    }
    cVar9 = '\0';
LAB_0010da76:
    if (cVar9 != '\0') {
      if (cVar9 == '\x02') {
        if (pOVar5 == (OpusServerInfo *)0x0) {
          pvVar3 = op_url_stream_create_impl
                             (_cb,_url,_skip_certificate_check,_proxy_host,_proxy_port,_proxy_user,
                              _proxy_pass,(OpusServerInfo *)0x0);
        }
        else {
          _info->server = (char *)0x0;
          _info->content_type = (char *)0x0;
          _info->genre = (char *)0x0;
          _info->url = (char *)0x0;
          _info->name = (char *)0x0;
          _info->description = (char *)0x0;
          _info->bitrate_kbps = -1;
          _info->is_public = -1;
          _info->is_ssl = 0;
          pvVar3 = op_url_stream_create_impl
                             (_cb,_url,_skip_certificate_check,_proxy_host,_proxy_port,_proxy_user,
                              _proxy_pass,_info);
          if (pvVar3 == (void *)0x0) {
            opus_server_info_clear(_info);
          }
          else {
            *_pinfo = pOVar5;
          }
        }
      }
      else {
        pvVar3 = (void *)0x0;
      }
      return pvVar3;
    }
  } while( true );
}

Assistant:

static void *op_url_stream_vcreate_impl(OpusFileCallbacks *_cb,
 const char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,va_list _ap){
  int             skip_certificate_check;
  const char     *proxy_host;
  opus_int32      proxy_port;
  const char     *proxy_user;
  const char     *proxy_pass;
  OpusServerInfo *pinfo;
  skip_certificate_check=0;
  proxy_host=NULL;
  proxy_port=8080;
  proxy_user=NULL;
  proxy_pass=NULL;
  pinfo=NULL;
  *_pinfo=NULL;
  for(;;){
    ptrdiff_t request;
    request=va_arg(_ap,char *)-(char *)NULL;
    /*If we hit NULL, we're done processing options.*/
    if(!request)break;
    switch(request){
      case OP_SSL_SKIP_CERTIFICATE_CHECK_REQUEST:{
        skip_certificate_check=!!va_arg(_ap,opus_int32);
      }break;
      case OP_HTTP_PROXY_HOST_REQUEST:{
        proxy_host=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PORT_REQUEST:{
        proxy_port=va_arg(_ap,opus_int32);
        if(proxy_port<0||proxy_port>(opus_int32)65535)return NULL;
      }break;
      case OP_HTTP_PROXY_USER_REQUEST:{
        proxy_user=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PASS_REQUEST:{
        proxy_pass=va_arg(_ap,const char *);
      }break;
      case OP_GET_SERVER_INFO_REQUEST:{
        pinfo=va_arg(_ap,OpusServerInfo *);
      }break;
      /*Some unknown option.*/
      default:return NULL;
    }
  }
  /*If the caller has requested server information, proxy it to a local copy to
     simplify error handling.*/
  if(pinfo!=NULL){
    void *ret;
    opus_server_info_init(_info);
    ret=op_url_stream_create_impl(_cb,_url,skip_certificate_check,
     proxy_host,proxy_port,proxy_user,proxy_pass,_info);
    if(ret!=NULL)*_pinfo=pinfo;
    else opus_server_info_clear(_info);
    return ret;
  }
  return op_url_stream_create_impl(_cb,_url,skip_certificate_check,
   proxy_host,proxy_port,proxy_user,proxy_pass,NULL);
}